

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O1

int resolveLocal(Compiler *compiler,Token *name)

{
  int iVar1;
  uint unaff_EBP;
  uint uVar2;
  bool bVar3;
  
  uVar2 = compiler->localCount;
  do {
    if ((int)uVar2 < 1) {
      return -1;
    }
    uVar2 = uVar2 - 1;
    if (name->length == compiler->locals[uVar2].name.length) {
      iVar1 = bcmp(name->start,compiler->locals[uVar2].name.start,(long)name->length);
      bVar3 = iVar1 == 0;
    }
    else {
      bVar3 = false;
    }
    if ((bVar3) && (unaff_EBP = uVar2, compiler->locals[uVar2].depth == -1)) {
      errorAt(&parser.previous,"Cannot read local variable in its own initializer.");
    }
  } while (!bVar3);
  return unaff_EBP;
}

Assistant:

static int resolveLocal(Compiler *compiler, Token *name) {
    for (int i = compiler->localCount - 1; i >= 0; i--) {
        Local *local = &compiler->locals[i];
        if (identifiersEqual(name, &local->name)) {
            if (local->depth == -1) {
                error("Cannot read local variable in its own initializer.");
            }
            return i;
        }
    }

    return -1;
}